

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  undefined2 uVar1;
  uint16_t uVar2;
  int *in_RDI;
  uint32_t lowvalue;
  uint32_t key;
  uint8_t typecode;
  container_t *container;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint32_t local_4;
  
  if (*in_RDI < 1) {
    local_4 = 0;
  }
  else {
    uVar1 = *(undefined2 *)(*(long *)(in_RDI + 4) + (long)(*in_RDI + -1) * 2);
    uVar2 = container_maximum((container_t *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),'\0');
    local_4 = CONCAT22(uVar1,uVar2);
  }
  return local_4;
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}